

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder_tests.cpp
# Opt level: O2

void __thiscall
bson_stream_encoder_reset_test_fixture::bson_stream_encoder_reset_test_fixture
          (bson_stream_encoder_reset_test_fixture *this)

{
  allocator<char> local_51;
  binary_stream_sink local_50;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->output2);
  jsoncons::binary_stream_sink::binary_stream_sink
            (&local_50,(basic_ostream<char,_std::char_traits<char>_> *)this);
  jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
  basic_bson_encoder(&this->encoder,&local_50,&local_51);
  jsoncons::binary_stream_sink::~binary_stream_sink(&local_50);
  return;
}

Assistant:

bson_stream_encoder_reset_test_fixture() : encoder(output1) {}